

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O1

Token __thiscall
slang::parsing::NumberParser::parseReal<slang::parsing::Preprocessor>
          (NumberParser *this,Preprocessor *stream)

{
  long lVar1;
  DiagCode DVar2;
  NumericTokenFlags NVar3;
  SourceLocation SVar4;
  Diagnostic *this_00;
  real_t rVar5;
  DiagCode *pDVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  string_view sVar15;
  Token literal;
  DiagCode local_5c;
  real_t local_58;
  NumberParser *local_50;
  Token local_48;
  long local_38;
  
  local_50 = this;
  local_48 = Preprocessor::consume(stream);
  NVar3 = Token::numericFlags(&local_48);
  if ((NVar3.raw & 0x40) != 0) {
    dVar14 = Token::realValue(&local_48);
    uVar8 = -(uint)(dVar14 == 0.0) & 1;
    SVar4 = Token::location(&local_48);
    local_58.v = *(double *)(&DAT_00480f80 + (ulong)uVar8 * 8);
    this_00 = addDiag(local_50,(DiagCode)(uVar8 * 0x10000 + 0xb0003),SVar4);
    Diagnostic::operator<<(this_00,local_58);
  }
  sVar15 = Token::rawText(&local_48);
  pcVar7 = sVar15._M_str;
  rVar5.v = (double)sVar15._M_len;
  if (rVar5.v != 0.0) {
    lVar9 = -(long)rVar5.v;
    uVar12 = 1;
    lVar11 = 0x10000000;
    lVar13 = 0;
    local_58.v = rVar5.v;
    local_38 = lVar9;
    do {
      if (pcVar7[uVar12 - 1] == 0x2e) {
        local_5c.subsystem = Numeric;
        local_5c.code = 5;
        if ((lVar9 + uVar12 == 0) || (9 < (byte)(pcVar7[uVar12] - 0x30U))) {
          if (((ulong)rVar5.v <= uVar12) ||
             (pDVar6 = (DiagCode *)&slang::diag::DigitsLeadingUnderscore, pcVar7[uVar12] != '_')) {
            pDVar6 = &local_5c;
          }
          DVar2 = *pDVar6;
          SVar4 = Token::location(&local_48);
          addDiag(local_50,DVar2,(SourceLocation)((long)SVar4 + lVar11));
          rVar5.v = local_58.v;
        }
      }
      else if ((pcVar7[uVar12 - 1] & 0xdfU) == 0x45) {
        uVar10 = uVar12;
        if ((uVar12 < (ulong)rVar5.v) && ((pcVar7[uVar12] == '+' || (pcVar7[uVar12] == '-')))) {
          uVar10 = lVar13 + 2;
        }
        local_5c.subsystem = Numeric;
        local_5c.code = 4;
        if (((double)uVar10 == rVar5.v) || (lVar9 = local_38, 9 < (byte)(pcVar7[uVar10] - 0x30U))) {
          if (((ulong)rVar5.v <= uVar10) ||
             (pDVar6 = (DiagCode *)&slang::diag::DigitsLeadingUnderscore, pcVar7[uVar10] != '_')) {
            pDVar6 = &local_5c;
          }
          DVar2 = *pDVar6;
          SVar4 = Token::location(&local_48);
          addDiag(local_50,DVar2,(SourceLocation)(uVar10 * 0x10000000 + (long)SVar4));
          rVar5.v = local_58.v;
          lVar9 = local_38;
        }
      }
      lVar1 = lVar9 + uVar12;
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x10000000;
      lVar13 = lVar13 + 1;
    } while (lVar1 != 0);
  }
  return local_48;
}

Assistant:

Token parseReal(TStream& stream) {
        // have to check for overflow here, now that we know this is actually a real
        auto literal = stream.consume();
        if (literal.numericFlags().outOfRange()) {
            if (literal.realValue() == 0) {
                addDiag(diag::RealLiteralUnderflow, literal.location())
                    << real_t(std::numeric_limits<double>::denorm_min());
            }
            else {
                SLANG_ASSERT(!std::isfinite(literal.realValue()));
                addDiag(diag::RealLiteralOverflow, literal.location())
                    << real_t(std::numeric_limits<double>::max());
            }
        }

        // Enforce extra rules about where digits and underscores
        // are allowed to go in a real literal.
        auto raw = literal.rawText();
        auto len = raw.length();
        for (size_t i = 0; i < len; i++) {
            char c = raw[i];
            size_t j = i + 1;

            auto checkForDigit = [&](DiagCode missingCode) {
                if (j == len || !isDecimalDigit(raw[j])) {
                    auto code = (j < len && raw[j] == '_') ? diag::DigitsLeadingUnderscore
                                                           : missingCode;
                    addDiag(code, literal.location() + j);
                }
            };

            if (c == '.') {
                checkForDigit(diag::MissingFractionalDigits);
            }
            else if (c == 'e' || c == 'E') {
                if (j < len && (raw[j] == '+' || raw[j] == '-'))
                    j++;

                checkForDigit(diag::MissingExponentDigits);
            }
        }

        return literal;
    }